

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O3

void __thiscall libsgp4::Tle::ExtractDouble(Tle *this,string *str,int point_pos,double *val)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  runtime_error *prVar4;
  char cVar5;
  char *pcVar6;
  string temp;
  string local_58;
  double *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_38 = val;
  if (str->_M_string_length != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    bVar2 = false;
    pcVar6 = pcVar3;
    do {
      cVar5 = (char)&local_58;
      if (point_pos < 0) {
        if (pcVar6 == pcVar3 && point_pos == -1) {
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::push_back(cVar5);
        }
LAB_00109e43:
        if (9 < (int)*pcVar6 - 0x30U) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"Invalid digit");
LAB_00109f2b:
          *(undefined ***)prVar4 = &PTR__runtime_error_0010ed90;
          __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
        }
LAB_00109e56:
        std::__cxx11::string::push_back(cVar5);
      }
      else {
        if (pcVar3 + ((ulong)(uint)point_pos - 1) <= pcVar6) {
          if (pcVar6 != pcVar3 + ((ulong)(uint)point_pos - 1)) goto LAB_00109e43;
          if (local_58._M_string_length == 0) {
            std::__cxx11::string::push_back(cVar5);
          }
          if (*pcVar6 != '.') {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Failed to find decimal point");
            goto LAB_00109f2b;
          }
          goto LAB_00109e56;
        }
        cVar1 = *pcVar6;
        if ((pcVar6 == pcVar3) && ((cVar1 == '-' || (cVar1 == '+')))) {
          std::__cxx11::string::push_back(cVar5);
        }
        else if ((int)cVar1 - 0x30U < 10) {
          bVar2 = true;
          std::__cxx11::string::push_back(cVar5);
        }
        else {
          if (bVar2) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Unexpected non digit");
LAB_00109fa3:
            *(undefined ***)prVar4 = &PTR__runtime_error_0010ed90;
            __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (cVar1 != ' ') {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Invalid character");
            goto LAB_00109fa3;
          }
          bVar2 = false;
        }
      }
      pcVar6 = pcVar6 + 1;
      pcVar3 = (str->_M_dataplus)._M_p;
    } while (pcVar6 != pcVar3 + str->_M_string_length);
  }
  bVar2 = Util::FromString<double>(&local_58,local_38);
  if (!bVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Failed to convert value to double");
    *(undefined ***)prVar4 = &PTR__runtime_error_0010ed90;
    __cxa_throw(prVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Tle::ExtractDouble(const std::string& str, int point_pos, double& val)
{
    std::string temp;
    bool found_digit = false;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        /*
         * integer part
         */
        if (point_pos >= 0 && i < str.begin() + point_pos - 1)
        {
            bool done = false;

            if (i == str.begin())
            {
                if(*i == '-' || *i == '+')
                {
                    /*
                     * first character could be signed
                     */
                    temp += *i;
                    done = true;
                }
            }

            if (!done)
            {
                if (isdigit(*i))
                {
                    found_digit = true;
                    temp += *i;
                }
                else if (found_digit)
                {
                    throw TleException("Unexpected non digit");
                }
                else if (*i != ' ')
                {
                    throw TleException("Invalid character");
                }
            }
        }
        /*
         * decimal point
         */
        else if (point_pos >= 0 && i == str.begin() + point_pos - 1)
        {
            if (temp.length() == 0)
            {
                /*
                 * integer part is blank, so add a '0'
                 */
                temp += '0';
            }

            if (*i == '.')
            {
                /*
                 * decimal point found
                 */
                temp += *i;
            }
            else
            {
                throw TleException("Failed to find decimal point");
            }
        }
        /*
         * fraction part
         */
        else
        {
            if (i == str.begin() && point_pos == -1)
            {
                /*
                 * no decimal point expected, add 0. beginning
                 */
                temp += '0';
                temp += '.';
            }
            
            /*
             * should be a digit
             */
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}